

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O3

int32_t unorm2_getDecomposition_63
                  (UNormalizer2 *norm2,UChar32 c,UChar *decomposition,int32_t capacity,
                  UErrorCode *pErrorCode)

{
  char cVar1;
  int32_t iVar2;
  UnicodeString destString;
  Char16Ptr local_88;
  UChar *local_80;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if (decomposition == (UChar *)0x0) {
    if (capacity != 0) goto LAB_001a4366;
  }
  else if (capacity < 0) {
LAB_001a4366:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  icu_63::UnicodeString::UnicodeString(&local_70,decomposition,0,capacity);
  cVar1 = (**(code **)(*(long *)norm2 + 0x38))(norm2,c,&local_70);
  if (cVar1 == '\0') {
    iVar2 = -1;
  }
  else {
    local_88.p_ = decomposition;
    iVar2 = icu_63::UnicodeString::extract(&local_70,&local_88,capacity,pErrorCode);
    local_80 = local_88.p_;
  }
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
unorm2_getDecomposition(const UNormalizer2 *norm2,
                        UChar32 c, UChar *decomposition, int32_t capacity,
                        UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(decomposition==NULL ? capacity!=0 : capacity<0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString destString(decomposition, 0, capacity);
    if(reinterpret_cast<const Normalizer2 *>(norm2)->getDecomposition(c, destString)) {
        return destString.extract(decomposition, capacity, *pErrorCode);
    } else {
        return -1;
    }
}